

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void MIR_gen_finish(MIR_context_t ctx)

{
  gen_ctx *__ptr;
  FILE *__ptr_00;
  VARR_bitmap_t *__ptr_01;
  gen_ctx *pgVar1;
  MIR_module_t pMVar2;
  MIR_item_t pMVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  void *to;
  MIR_module_t *ppMVar8;
  MIR_item_t_conflict pMVar9;
  DLIST_MIR_item_t *pDVar10;
  char *pcVar11;
  MIR_context_t unaff_RBX;
  MIR_item_t_conflict addr;
  MIR_insn_t_conflict in_RSI;
  char *called_func;
  ra_ctx *prVar12;
  ra_ctx *prVar13;
  ra_ctx *ctx_00;
  MIR_item_t_conflict pMVar14;
  MIR_item_t_conflict pMVar15;
  ra_ctx *unaff_R12;
  ra_ctx *unaff_R13;
  undefined8 *puVar16;
  ra_ctx *unaff_R15;
  long lVar17;
  int iStack_6c;
  ra_ctx *prStack_68;
  MIR_item_t_conflict pMStack_60;
  MIR_context_t pMStack_58;
  ra_ctx *prStack_50;
  ra_ctx *prStack_48;
  gen_ctx *pgStack_40;
  ra_ctx *prStack_38;
  
  __ptr = ctx->gen_ctx;
  ctx_00 = (ra_ctx *)ctx;
  if (__ptr != (gen_ctx *)0x0) {
    unaff_R12 = (ra_ctx *)__ptr->data_flow_ctx;
    unaff_R15 = *(ra_ctx **)&unaff_R12->start_mem_loc;
    if ((unaff_R15 == (ra_ctx *)0x0) ||
       (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, unaff_RBX = ctx, ctx_00 == (ra_ctx *)0x0)) {
LAB_00154352:
      MIR_gen_finish_cold_95();
      prVar13 = ctx_00;
      ctx_00 = unaff_R15;
LAB_00154357:
      prVar12 = prVar13;
      MIR_gen_finish_cold_94();
LAB_0015435c:
      MIR_gen_finish_cold_93();
LAB_00154361:
      prVar13 = prVar12;
      MIR_gen_finish_cold_92();
LAB_00154366:
      MIR_gen_finish_cold_91();
LAB_0015436b:
      prVar12 = prVar13;
      MIR_gen_finish_cold_90();
LAB_00154370:
      MIR_gen_finish_cold_89();
LAB_00154375:
      prVar13 = prVar12;
      MIR_gen_finish_cold_88();
LAB_0015437a:
      MIR_gen_finish_cold_87();
LAB_0015437f:
      MIR_gen_finish_cold_86();
LAB_00154384:
      prVar12 = prVar13;
      MIR_gen_finish_cold_85();
LAB_00154389:
      MIR_gen_finish_cold_84();
LAB_0015438e:
      MIR_gen_finish_cold_83();
LAB_00154393:
      prVar13 = prVar12;
      MIR_gen_finish_cold_82();
LAB_00154398:
      MIR_gen_finish_cold_81();
LAB_0015439d:
      MIR_gen_finish_cold_80();
LAB_001543a2:
      prVar12 = prVar13;
      MIR_gen_finish_cold_79();
LAB_001543a7:
      MIR_gen_finish_cold_78();
LAB_001543ac:
      MIR_gen_finish_cold_77();
LAB_001543b1:
      MIR_gen_finish_cold_76();
LAB_001543b6:
      prVar13 = prVar12;
      MIR_gen_finish_cold_75();
LAB_001543bb:
      MIR_gen_finish_cold_74();
LAB_001543c0:
      prVar12 = prVar13;
      MIR_gen_finish_cold_73();
LAB_001543c5:
      MIR_gen_finish_cold_72();
LAB_001543ca:
      prVar13 = prVar12;
      MIR_gen_finish_cold_71();
LAB_001543cf:
      MIR_gen_finish_cold_70();
LAB_001543d4:
      prVar12 = prVar13;
      MIR_gen_finish_cold_69();
LAB_001543d9:
      MIR_gen_finish_cold_68();
LAB_001543de:
      prVar13 = prVar12;
      MIR_gen_finish_cold_67();
LAB_001543e3:
      MIR_gen_finish_cold_66();
LAB_001543e8:
      prVar12 = prVar13;
      MIR_gen_finish_cold_65();
LAB_001543ed:
      MIR_gen_finish_cold_64();
LAB_001543f2:
      unaff_R15 = prVar12;
      MIR_gen_finish_cold_63();
    }
    else {
      free(ctx_00);
      free(unaff_R15);
      *(gen_ctx **)&unaff_R12->start_mem_loc = (gen_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->data_flow_ctx;
      prVar12 = (ra_ctx *)unaff_R12->reg_renumber;
      prVar13 = unaff_R15;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154357;
      free(prVar13);
      free(prVar12);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      ctx_00 = (ra_ctx *)__ptr->data_flow_ctx->bb_to_consider;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015435c;
      free(prVar12);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->data_flow_ctx;
      free(prVar12);
      __ptr->data_flow_ctx = (data_flow_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar13 = *(ra_ctx **)&unaff_R12->start_mem_loc;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154361;
      free(prVar12);
      free(prVar13);
      *(gen_ctx **)&unaff_R12->start_mem_loc = (gen_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154366;
      free(prVar13);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar12 = (ra_ctx *)unaff_R12->sorted_regs;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015436b;
      free(prVar13);
      free(prVar12);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->used_locs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154370;
      free(prVar12);
      free(ctx_00);
      unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
      unaff_R13 = (ra_ctx *)__ptr->ssa_ctx;
      prVar13 = (ra_ctx *)unaff_R13->busy_used_locs;
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((VARR_MIR_proto_t *)prVar13->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)prVar13);
        ctx_00 = (ra_ctx *)unaff_R13->busy_used_locs;
        prVar12 = prVar13;
      }
      prVar13 = (ra_ctx *)ctx_00->spill_gaps;
      unaff_R12 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154375;
      free(prVar12);
      free(prVar13);
      ctx_00->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R12 = (ra_ctx *)unaff_R13->busy_used_locs;
      ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015437a;
      free(prVar13);
      free(ctx_00);
      unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar13 = (ra_ctx *)unaff_R13->busy_used_locs;
      free(prVar13);
      unaff_R13->busy_used_locs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015437f;
      free(prVar13);
      free(ctx_00);
      unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      prVar12 = (ra_ctx *)unaff_R12->spill_gaps;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154384;
      free(prVar13);
      free(prVar12);
      unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->ssa_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154389;
      free(prVar12);
      free(ctx_00);
      unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->ssa_ctx;
      free(prVar12);
      __ptr->ssa_ctx = (ssa_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015438e;
      free(prVar12);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R13 = (ra_ctx *)__ptr->gvn_ctx;
      prVar13 = (ra_ctx *)unaff_R13->used_locs;
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((VARR_MIR_proto_t *)prVar13->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_expr_t_clear((HTAB_expr_t *)prVar13);
        ctx_00 = (ra_ctx *)unaff_R13->used_locs;
        prVar12 = prVar13;
      }
      prVar13 = (ra_ctx *)ctx_00->spill_gaps;
      unaff_R12 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154393;
      free(prVar12);
      free(prVar13);
      ctx_00->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R12 = (ra_ctx *)unaff_R13->used_locs;
      ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154398;
      free(prVar13);
      free(ctx_00);
      unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
      free((VARR_bb_insn_t *)unaff_R13->used_locs);
      unaff_R13->used_locs = (VARR_bitmap_t *)0x0;
      prVar13 = (ra_ctx *)__ptr->gvn_ctx->temp_mem_insn;
      free(prVar13);
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015439d;
      free(prVar13);
      free(ctx_00);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      unaff_R13 = (ra_ctx *)__ptr->gvn_ctx;
      prVar12 = (ra_ctx *)unaff_R13->busy_used_locs;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((VARR_MIR_proto_t *)prVar12->var_bbs != (VARR_MIR_proto_t *)0x0) {
        HTAB_mem_expr_t_clear((HTAB_mem_expr_t *)prVar12);
        ctx_00 = (ra_ctx *)unaff_R13->busy_used_locs;
        prVar13 = prVar12;
      }
      prVar12 = (ra_ctx *)ctx_00->spill_gaps;
      unaff_R12 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543a2;
      free(prVar13);
      free(prVar12);
      ctx_00->spill_gaps = (VARR_lr_gap_t *)0x0;
      unaff_R12 = (ra_ctx *)unaff_R13->busy_used_locs;
      ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543a7;
      free(prVar12);
      free(ctx_00);
      unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
      prVar12 = (ra_ctx *)unaff_R13->busy_used_locs;
      free(prVar12);
      unaff_R13->busy_used_locs = (VARR_bitmap_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->gvn_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543ac;
      free(prVar12);
      free(ctx_00);
      unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->gvn_ctx;
      free(prVar12);
      __ptr->gvn_ctx = (gvn_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[3];
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543b1;
      free(prVar12);
      free(ctx_00);
      unaff_R12->lr_gap_bitmaps[3] = (bitmap_t)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      prVar13 = (ra_ctx *)((DLIST_MIR_item_t *)(unaff_R12->lr_gap_bitmaps + 4))->head;
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543b6;
      free(prVar12);
      free(prVar13);
      ((DLIST_MIR_item_t *)(unaff_R12->lr_gap_bitmaps + 4))->head = (MIR_item_t_conflict)0x0;
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->live_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543bb;
      free(prVar13);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->lr_ctx->referenced_vars;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543c0;
      free(prVar13);
      free(prVar12);
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->points_with_born_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543c5;
      free(prVar12);
      free(ctx_00);
      prVar13 = (ra_ctx *)__ptr->lr_ctx->points_with_dead_vars;
      prVar12 = ctx_00;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543ca;
      free(prVar12);
      free(prVar13);
      ctx_00 = (ra_ctx *)__ptr->lr_ctx->points_with_born_or_dead_vars;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543cf;
      free(prVar13);
      free(ctx_00);
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      __ptr_00 = (FILE *)unaff_R12->used_locs;
      while (__ptr_00 != (FILE *)0x0) {
        unaff_R12->used_locs = (VARR_bitmap_t *)__ptr_00->_IO_read_base;
        free(__ptr_00);
        unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
        __ptr_00 = (FILE *)unaff_R12->used_locs;
      }
      __ptr_01 = unaff_R12->busy_used_locs;
      while (__ptr_01 != (VARR_bitmap_t *)0x0) {
        unaff_R12->busy_used_locs = (VARR_bitmap_t *)__ptr_01->size;
        free(__ptr_01);
        unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
        __ptr_01 = unaff_R12->busy_used_locs;
      }
      prVar12 = (ra_ctx *)unaff_R12->reg_renumber;
      prVar13 = (ra_ctx *)0x0;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543d4;
      free(prVar13);
      free(prVar12);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->lr_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543d9;
      free(prVar12);
      free(ctx_00);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      prVar12 = (ra_ctx *)__ptr->lr_ctx;
      free(prVar12);
      __ptr->lr_ctx = (lr_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      prVar13 = *(ra_ctx **)&unaff_R12->start_mem_loc;
      ctx_00 = prVar13;
      if ((prVar13 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543de;
      free(prVar12);
      free(prVar13);
      *(gen_ctx **)&unaff_R12->start_mem_loc = (gen_ctx *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543e3;
      free(prVar13);
      free(ctx_00);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = (ra_ctx *)__ptr->coalesce_ctx;
      prVar12 = (ra_ctx *)unaff_R12->sorted_regs;
      prVar13 = ctx_00;
      ctx_00 = prVar12;
      if ((prVar12 == (ra_ctx *)0x0) ||
         (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001543e8;
      free(prVar13);
      free(prVar12);
      unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
      ctx_00 = (ra_ctx *)__ptr->coalesce_ctx->conflict_matrix;
      if ((ctx_00 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543ed;
      free(prVar12);
      free(ctx_00);
      prVar12 = (ra_ctx *)__ptr->coalesce_ctx;
      free(prVar12);
      __ptr->coalesce_ctx = (coalesce_ctx *)0x0;
      unaff_R12 = __ptr->ra_ctx;
      unaff_R15 = (ra_ctx *)unaff_R12->reg_renumber;
      ctx_00 = unaff_R15;
      if ((unaff_R15 == (ra_ctx *)0x0) ||
         (prVar12 = (ra_ctx *)unaff_R15->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001543f2;
      free(prVar12);
      free(unaff_R15);
      unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
      unaff_R12 = __ptr->ra_ctx;
      ctx_00 = (ra_ctx *)unaff_R12->sorted_regs;
      if ((ctx_00 != (ra_ctx *)0x0) &&
         (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 != (ra_ctx *)0x0)) {
        free(unaff_R15);
        free(ctx_00);
        unaff_R12->sorted_regs = (VARR_allocno_info_t *)0x0;
        while( true ) {
          unaff_R12 = __ptr->ra_ctx;
          unaff_R15 = (ra_ctx *)unaff_R12->used_locs;
          if (unaff_R15 == (ra_ctx *)0x0) break;
          pgVar1 = *(gen_ctx **)&unaff_R15->start_mem_loc;
          if (pgVar1 == (gen_ctx *)0x0) {
            ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
            if (ctx_00 == (ra_ctx *)0x0) goto LAB_001544d8;
            free(ctx_00);
            free(unaff_R15);
            unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
            ctx_00 = unaff_R15;
            goto LAB_0015379a;
          }
          if ((MIR_item_t)unaff_R15->sorted_regs == (MIR_item_t)0x0) goto LAB_00154339;
          *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar1[-1].spot_attrs + 7);
          unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar1 * 8 + -8);
          if ((unaff_R15 == (ra_ctx *)0x0) ||
             (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0))
          goto LAB_00154311;
          free(ctx_00);
          free(unaff_R15);
          ctx_00 = unaff_R15;
        }
        goto LAB_0015432a;
      }
    }
    MIR_gen_finish_cold_62();
    ctx = unaff_RBX;
LAB_001543fc:
    MIR_gen_finish_cold_55();
LAB_00154401:
    prVar13 = unaff_R15;
    MIR_gen_finish_cold_54();
LAB_00154406:
    MIR_gen_finish_cold_53();
    goto LAB_0015440b;
  }
  goto LAB_001544d3;
LAB_0015379a:
  unaff_R12 = __ptr->ra_ctx;
  unaff_R15 = (ra_ctx *)unaff_R12->busy_used_locs;
  if (unaff_R15 == (ra_ctx *)0x0) goto LAB_0015432f;
  pgVar1 = *(gen_ctx **)&unaff_R15->start_mem_loc;
  if (pgVar1 == (gen_ctx *)0x0) {
    ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
    if (ctx_00 == (ra_ctx *)0x0) goto LAB_001544dd;
    free(ctx_00);
    free(unaff_R15);
    unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
    ctx_00 = unaff_R15;
    goto LAB_00153818;
  }
  if ((MIR_item_t)unaff_R15->sorted_regs == (MIR_item_t)0x0) goto LAB_0015433e;
  *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar1[-1].spot_attrs + 7);
  unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar1 * 8 + -8);
  if ((unaff_R15 == (ra_ctx *)0x0) ||
     (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0)) goto LAB_00154316;
  free(ctx_00);
  free(unaff_R15);
  ctx_00 = unaff_R15;
  goto LAB_0015379a;
LAB_00153818:
  unaff_R12 = __ptr->ra_ctx;
  unaff_R15 = (ra_ctx *)unaff_R12->var_bbs;
  if (unaff_R15 == (ra_ctx *)0x0) goto LAB_00154334;
  pgVar1 = *(gen_ctx **)&unaff_R15->start_mem_loc;
  if (pgVar1 == (gen_ctx *)0x0) {
    ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
    if (ctx_00 == (ra_ctx *)0x0) goto LAB_001544e2;
    free(ctx_00);
    free(unaff_R15);
    unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->spill_gaps;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_001543fc;
    free(unaff_R15);
    free(ctx_00);
    unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    prVar13 = (ra_ctx *)unaff_R12->curr_gaps;
    unaff_R15 = ctx_00;
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (unaff_R15 = (ra_ctx *)prVar13->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_00154401;
    free(unaff_R15);
    free(prVar13);
    unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0x23];
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154406;
    free(prVar13);
    free(ctx_00);
    unaff_R12->lr_gap_bitmaps[0x23] = (bitmap_t)0x0;
    unaff_R12 = (ra_ctx *)0x8;
    goto LAB_0015394a;
  }
  if ((MIR_item_t)unaff_R15->sorted_regs == (MIR_item_t)0x0) goto LAB_00154348;
  *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar1[-1].spot_attrs + 7);
  unaff_R15 = *(ra_ctx **)((long)unaff_R15->sorted_regs + (long)pgVar1 * 8 + -8);
  if ((unaff_R15 == (ra_ctx *)0x0) ||
     (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 == (ra_ctx *)0x0)) goto LAB_0015431b;
  free(ctx_00);
  free(unaff_R15);
  ctx_00 = unaff_R15;
  goto LAB_00153818;
code_r0x00153c1c:
  free(ctx_00);
  free(unaff_R15);
  unaff_R12 = (ra_ctx *)((long)&unaff_R12->start_mem_loc + 1);
  ctx_00 = unaff_R15;
  if (unaff_R12 == (ra_ctx *)0x20) goto code_r0x00153c32;
  goto LAB_00153c02;
code_r0x00153c32:
  prVar13 = (ra_ctx *)__ptr->tied_regs;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (unaff_R15 = (ra_ctx *)prVar13->sorted_regs, unaff_R15 == (ra_ctx *)0x0)) goto LAB_0015443d;
  free(unaff_R15);
  free(prVar13);
  ctx_00 = (ra_ctx *)__ptr->addr_regs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154442;
  free(prVar13);
  free(ctx_00);
  prVar12 = (ra_ctx *)__ptr->insn_to_consider;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154447;
  free(prVar13);
  free(prVar12);
  ctx_00 = (ra_ctx *)__ptr->func_used_hard_regs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015444c;
  free(prVar12);
  free(ctx_00);
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->used_locs;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154451;
  free(prVar12);
  free(prVar13);
  unaff_R12->used_locs = (VARR_bitmap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->var_bbs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154456;
  free(prVar13);
  free(ctx_00);
  unaff_R12->var_bbs = (VARR_bitmap_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->ctx;
  in_RSI = __ptr->target_ctx->temp_jump;
  _MIR_free_insn((MIR_context_t)prVar13,in_RSI);
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar12 = (ra_ctx *)unaff_R12->spill_gaps;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015445b;
  free(prVar13);
  free(prVar12);
  unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->busy_used_locs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154460;
  free(prVar12);
  free(ctx_00);
  unaff_R12->busy_used_locs = (VARR_bitmap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->curr_gaps;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154465;
  free(prVar12);
  free(prVar13);
  unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0];
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015446a;
  free(prVar13);
  free(ctx_00);
  unaff_R12->lr_gap_bitmaps[0] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar12 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[1];
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015446f;
  free(prVar13);
  free(prVar12);
  unaff_R12->lr_gap_bitmaps[1] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)((MIR_module *)(unaff_R12->lr_gap_bitmaps + 2))->data;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154474;
  free(prVar12);
  free(ctx_00);
  ((MIR_module *)(unaff_R12->lr_gap_bitmaps + 2))->data = (void *)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  prVar13 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[3];
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154479;
  free(prVar12);
  free(prVar13);
  unaff_R12->lr_gap_bitmaps[3] = (bitmap_t)0x0;
  unaff_R12 = (ra_ctx *)__ptr->target_ctx;
  ctx_00 = (ra_ctx *)((DLIST_MIR_item_t *)(unaff_R12->lr_gap_bitmaps + 4))->head;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015447e;
  free(prVar13);
  free(ctx_00);
  ((DLIST_MIR_item_t *)(unaff_R12->lr_gap_bitmaps + 4))->head = (MIR_item_t_conflict)0x0;
  free(__ptr->target_ctx);
  __ptr->target_ctx = (target_ctx *)0x0;
  ctx_00 = (ra_ctx *)(__ptr->free_dead_vars).head;
  if (ctx_00 != (ra_ctx *)0x0) {
    unaff_R15 = (ra_ctx *)&__ptr->free_dead_vars;
    unaff_R12 = (ra_ctx *)&(__ptr->free_dead_vars).tail;
    do {
      pMVar2 = (MIR_module_t)ctx_00->reg_renumber;
      pMVar3 = (MIR_item_t)ctx_00->sorted_regs;
      pDVar10 = &pMVar2->items;
      if (pMVar2 == (MIR_module_t)0x0) {
        pDVar10 = (DLIST_MIR_item_t *)unaff_R15;
      }
      pDVar10->head = pMVar3;
      if (pMVar3 == (MIR_item_t)0x0) {
        ppMVar8 = (MIR_module_t *)unaff_R12;
        if (*(ra_ctx **)unaff_R12 != ctx_00) goto LAB_0015434d;
      }
      else {
        ppMVar8 = &pMVar3->module;
      }
      *ppMVar8 = pMVar2;
      free(ctx_00);
      ctx_00 = (ra_ctx *)((DLIST_dead_var_t *)unaff_R15)->head;
    } while (ctx_00 != (ra_ctx *)0x0);
  }
  prVar13 = (ra_ctx *)__ptr->data_flow_ctx;
  free(prVar13);
  prVar12 = (ra_ctx *)__ptr->temp_bitmap;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154483;
  free(prVar13);
  free(prVar12);
  ctx_00 = (ra_ctx *)__ptr->temp_bitmap2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154488;
  free(prVar12);
  free(ctx_00);
  prVar13 = (ra_ctx *)__ptr->temp_bitmap3;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015448d;
  free(prVar12);
  free(prVar13);
  ctx_00 = (ra_ctx *)__ptr->temp_ops;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154492;
  free(prVar13);
  free(ctx_00);
  __ptr->temp_ops = (VARR_MIR_op_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->temp_insns;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154497;
  free(prVar13);
  free(prVar12);
  __ptr->temp_insns = (VARR_MIR_insn_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->temp_insns2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_0015449c;
  free(prVar12);
  free(ctx_00);
  __ptr->temp_insns2 = (VARR_MIR_insn_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->temp_bb_insns;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544a1;
  free(prVar12);
  free(prVar13);
  __ptr->temp_bb_insns = (VARR_bb_insn_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->temp_bb_insns2;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544a6;
  free(prVar13);
  free(ctx_00);
  __ptr->temp_bb_insns2 = (VARR_bb_insn_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->loop_nodes;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544ab;
  free(prVar13);
  free(prVar12);
  __ptr->loop_nodes = (VARR_loop_node_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->queue_nodes;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544b0;
  free(prVar12);
  free(ctx_00);
  __ptr->queue_nodes = (VARR_loop_node_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->loop_entries;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544b5;
  free(prVar12);
  free(prVar13);
  __ptr->loop_entries = (VARR_loop_node_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->mem_attrs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544ba;
  free(prVar13);
  free(ctx_00);
  __ptr->mem_attrs = (VARR_mem_attr_t *)0x0;
  prVar12 = (ra_ctx *)__ptr->target_succ_bb_versions;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_001544bf;
  free(prVar13);
  free(prVar12);
  __ptr->target_succ_bb_versions = (VARR_target_bb_version_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->succ_bb_addrs;
  if ((ctx_00 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544c4;
  free(prVar12);
  free(ctx_00);
  __ptr->succ_bb_addrs = (VARR_void_ptr_t *)0x0;
  prVar13 = (ra_ctx *)__ptr->spot_attrs;
  prVar12 = ctx_00;
  ctx_00 = prVar13;
  if ((prVar13 == (ra_ctx *)0x0) ||
     (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_001544c9;
  free(prVar12);
  free(prVar13);
  __ptr->spot_attrs = (VARR_spot_attr_t *)0x0;
  ctx_00 = (ra_ctx *)__ptr->spot2attr;
  unaff_R15 = ctx_00;
  if ((ctx_00 != (ra_ctx *)0x0) &&
     (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 != (ra_ctx *)0x0)) {
    free(prVar13);
    free(ctx_00);
    __ptr->spot2attr = (VARR_spot_attr_t *)0x0;
    while (unaff_R15 = (ra_ctx *)__ptr->to_free, unaff_R15 != (ra_ctx *)0x0) {
      pgVar1 = *(gen_ctx **)&unaff_R15->start_mem_loc;
      ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
      if (pgVar1 == (gen_ctx *)0x0) {
        if (ctx_00 != (ra_ctx *)0x0) {
          free(ctx_00);
          free(unaff_R15);
          free(__ptr);
          ctx->gen_ctx = (gen_ctx *)0x0;
          return;
        }
        goto LAB_001544e7;
      }
      if (ctx_00 == (ra_ctx *)0x0) goto LAB_00154325;
      *(gen_ctx **)&unaff_R15->start_mem_loc = (gen_ctx *)((long)&pgVar1[-1].spot_attrs + 7);
      ctx_00 = (ra_ctx *)ctx_00->lr_gap_bitmaps[(long)((long)&pgVar1[-1].spot2attr + 7)];
      free(ctx_00);
    }
LAB_00154320:
    MIR_gen_finish_cold_11();
LAB_00154325:
    MIR_gen_finish_cold_9();
LAB_0015432a:
    MIR_gen_finish_cold_61();
LAB_0015432f:
    MIR_gen_finish_cold_59();
LAB_00154334:
    MIR_gen_finish_cold_57();
LAB_00154339:
    MIR_gen_finish_cold_2();
LAB_0015433e:
    MIR_gen_finish_cold_4();
LAB_00154343:
    MIR_gen_finish_cold_7();
LAB_00154348:
    MIR_gen_finish_cold_6();
LAB_0015434d:
    MIR_gen_finish_cold_8();
    goto LAB_00154352;
  }
  goto LAB_001544ce;
LAB_0015394a:
  do {
    unaff_R15 = (ra_ctx *)__ptr->ra_ctx->lr_gap_bitmaps[(long)&unaff_R12[-1].out_reloads[7].var];
    if (unaff_R15 != (ra_ctx *)0x0) {
      ctx_00 = (ra_ctx *)unaff_R15->sorted_regs;
      if (ctx_00 == (ra_ctx *)0x0) goto LAB_00154343;
      free(ctx_00);
      free(unaff_R15);
      ctx_00 = unaff_R15;
    }
    unaff_R12 = (ra_ctx *)((long)&unaff_R12->start_mem_loc + 1);
  } while (unaff_R12 != (ra_ctx *)0x2a);
  unaff_R13 = __ptr->ra_ctx;
  prVar12 = (ra_ctx *)unaff_R13->lr_gap_tab;
  prVar13 = ctx_00;
  ctx_00 = prVar12;
  if ((VARR_MIR_proto_t *)prVar12->var_bbs != (VARR_MIR_proto_t *)0x0) {
    HTAB_lr_gap_t_clear((HTAB_lr_gap_t *)prVar12);
    ctx_00 = (ra_ctx *)unaff_R13->lr_gap_tab;
    prVar13 = prVar12;
  }
  prVar12 = (ra_ctx *)ctx_00->spill_gaps;
  unaff_R12 = prVar12;
  if ((prVar12 == (ra_ctx *)0x0) ||
     (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) {
LAB_0015440b:
    prVar12 = prVar13;
    MIR_gen_finish_cold_52();
LAB_00154410:
    MIR_gen_finish_cold_51();
LAB_00154415:
    prVar13 = prVar12;
    MIR_gen_finish_cold_50();
LAB_0015441a:
    MIR_gen_finish_cold_49();
LAB_0015441f:
    prVar12 = prVar13;
    MIR_gen_finish_cold_48();
LAB_00154424:
    MIR_gen_finish_cold_47();
LAB_00154429:
    prVar13 = prVar12;
    MIR_gen_finish_cold_46();
LAB_0015442e:
    MIR_gen_finish_cold_45();
LAB_00154433:
    unaff_R15 = prVar13;
    MIR_gen_finish_cold_44();
  }
  else {
    free(prVar13);
    free(prVar12);
    ctx_00->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = (ra_ctx *)unaff_R13->lr_gap_tab;
    ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154410;
    free(prVar12);
    free(ctx_00);
    unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
    prVar12 = (ra_ctx *)unaff_R13->lr_gap_tab;
    free(prVar12);
    unaff_R13->lr_gap_tab = (HTAB_lr_gap_t *)0x0;
    unaff_R12 = __ptr->ra_ctx;
    prVar13 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0x24];
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154415;
    free(prVar12);
    free(prVar13);
    unaff_R12->lr_gap_bitmaps[0x24] = (bitmap_t)0x0;
    ctx_00 = (ra_ctx *)__ptr->ra_ctx->conflict_locs1;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015441a;
    free(prVar13);
    free(ctx_00);
    prVar13 = __ptr->ra_ctx;
    free(prVar13);
    __ptr->ra_ctx = (ra_ctx *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    prVar12 = *(ra_ctx **)&unaff_R12->start_mem_loc;
    ctx_00 = prVar12;
    if ((prVar12 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)prVar12->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015441f;
    free(prVar13);
    free(prVar12);
    *(gen_ctx **)&unaff_R12->start_mem_loc = (gen_ctx *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->reg_renumber;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)ctx_00->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154424;
    free(prVar12);
    free(ctx_00);
    unaff_R12->reg_renumber = (VARR_MIR_reg_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    prVar13 = (ra_ctx *)unaff_R12->spill_gaps;
    prVar12 = ctx_00;
    ctx_00 = prVar13;
    if ((prVar13 == (ra_ctx *)0x0) ||
       (prVar12 = (ra_ctx *)prVar13->sorted_regs, prVar12 == (ra_ctx *)0x0)) goto LAB_00154429;
    free(prVar12);
    free(prVar13);
    unaff_R12->spill_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    ctx_00 = (ra_ctx *)unaff_R12->curr_gaps;
    if ((ctx_00 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)ctx_00->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_0015442e;
    free(prVar13);
    free(ctx_00);
    unaff_R12->curr_gaps = (VARR_lr_gap_t *)0x0;
    unaff_R12 = (ra_ctx *)__ptr->combine_ctx;
    unaff_R15 = (ra_ctx *)unaff_R12->lr_gap_bitmaps[0];
    prVar13 = ctx_00;
    ctx_00 = unaff_R15;
    if ((unaff_R15 == (ra_ctx *)0x0) ||
       (prVar13 = (ra_ctx *)unaff_R15->sorted_regs, prVar13 == (ra_ctx *)0x0)) goto LAB_00154433;
    free(prVar13);
    free(unaff_R15);
    unaff_R12->lr_gap_bitmaps[0] = (bitmap_t)0x0;
    ctx_00 = (ra_ctx *)__ptr->combine_ctx->vars_bitmap;
    if ((ctx_00 != (ra_ctx *)0x0) &&
       (unaff_R15 = (ra_ctx *)ctx_00->sorted_regs, unaff_R15 != (ra_ctx *)0x0)) {
      free(unaff_R15);
      free(ctx_00);
      ctx_00 = (ra_ctx *)__ptr->combine_ctx;
      free(ctx_00);
      unaff_R12 = (ra_ctx *)&DAT_0000000d;
      __ptr->combine_ctx = (combine_ctx *)0x0;
LAB_00153c02:
      unaff_R15 = (ra_ctx *)
                  __ptr->call_used_hard_regs[(long)((long)&unaff_R12[-1].out_reloads[6].hreg + 3)];
      if ((unaff_R15 != (ra_ctx *)0x0) &&
         (ctx_00 = (ra_ctx *)unaff_R15->sorted_regs, ctx_00 != (ra_ctx *)0x0))
      goto code_r0x00153c1c;
      MIR_gen_finish_cold_42();
LAB_00154311:
      MIR_gen_finish_cold_1();
LAB_00154316:
      MIR_gen_finish_cold_3();
LAB_0015431b:
      MIR_gen_finish_cold_5();
      goto LAB_00154320;
    }
  }
  MIR_gen_finish_cold_43();
LAB_0015443d:
  prVar13 = unaff_R15;
  MIR_gen_finish_cold_41();
LAB_00154442:
  MIR_gen_finish_cold_40();
LAB_00154447:
  prVar12 = prVar13;
  MIR_gen_finish_cold_39();
LAB_0015444c:
  MIR_gen_finish_cold_38();
LAB_00154451:
  prVar13 = prVar12;
  MIR_gen_finish_cold_37();
LAB_00154456:
  MIR_gen_finish_cold_36();
LAB_0015445b:
  prVar12 = prVar13;
  MIR_gen_finish_cold_35();
LAB_00154460:
  MIR_gen_finish_cold_34();
LAB_00154465:
  prVar13 = prVar12;
  MIR_gen_finish_cold_33();
LAB_0015446a:
  MIR_gen_finish_cold_32();
LAB_0015446f:
  prVar12 = prVar13;
  MIR_gen_finish_cold_31();
LAB_00154474:
  MIR_gen_finish_cold_30();
LAB_00154479:
  prVar13 = prVar12;
  MIR_gen_finish_cold_29();
LAB_0015447e:
  MIR_gen_finish_cold_28();
LAB_00154483:
  prVar12 = prVar13;
  MIR_gen_finish_cold_27();
LAB_00154488:
  MIR_gen_finish_cold_26();
LAB_0015448d:
  prVar13 = prVar12;
  MIR_gen_finish_cold_25();
LAB_00154492:
  MIR_gen_finish_cold_24();
LAB_00154497:
  prVar12 = prVar13;
  MIR_gen_finish_cold_23();
LAB_0015449c:
  MIR_gen_finish_cold_22();
LAB_001544a1:
  prVar13 = prVar12;
  MIR_gen_finish_cold_21();
LAB_001544a6:
  MIR_gen_finish_cold_20();
LAB_001544ab:
  prVar12 = prVar13;
  MIR_gen_finish_cold_19();
LAB_001544b0:
  MIR_gen_finish_cold_18();
LAB_001544b5:
  prVar13 = prVar12;
  MIR_gen_finish_cold_17();
LAB_001544ba:
  MIR_gen_finish_cold_16();
LAB_001544bf:
  prVar12 = prVar13;
  MIR_gen_finish_cold_15();
LAB_001544c4:
  MIR_gen_finish_cold_14();
LAB_001544c9:
  prVar13 = prVar12;
  MIR_gen_finish_cold_13();
  unaff_R15 = ctx_00;
LAB_001544ce:
  MIR_gen_finish_cold_12();
  unaff_RBX = ctx;
  ctx_00 = prVar13;
LAB_001544d3:
  ctx = unaff_RBX;
  MIR_gen_finish_cold_96();
LAB_001544d8:
  MIR_gen_finish_cold_60();
LAB_001544dd:
  MIR_gen_finish_cold_58();
LAB_001544e2:
  MIR_gen_finish_cold_56();
LAB_001544e7:
  MIR_gen_finish_cold_10();
  pMStack_58 = ctx;
  prStack_50 = unaff_R12;
  prStack_48 = unaff_R13;
  pgStack_40 = __ptr;
  prStack_38 = unaff_R15;
  if (in_RSI != (MIR_insn_t_conflict)0x0) {
    generate_func_code((MIR_context_t)ctx_00,(MIR_item_t)in_RSI,1);
    return;
  }
  lVar4 = *(long *)&ctx_00->start_mem_loc;
  plVar5 = *(long **)(*(long *)(lVar4 + 0x138) + 0x60);
  called_func = (char *)0x0;
  if (plVar5 != (long *)0x0) {
    lVar17 = *plVar5;
    if (lVar17 != 0) {
      puVar16 = (undefined8 *)(plVar5[2] + 8);
      prStack_68 = ctx_00;
      do {
        puVar6 = *(undefined8 **)(puVar16[-1] + 0x40);
        pMVar15 = (MIR_item_t_conflict)puVar6[0xd];
        pMVar9 = (MIR_item_t_conflict)*puVar16;
        iStack_6c = *(int *)((long)&pMVar9->data + 2);
        lVar7 = (long)iStack_6c;
        pMStack_60 = pMVar15;
        if (*(uint8_t *)&pMVar9->data == '@') {
          pMVar14 = (MIR_item_t_conflict)((long)&pMVar9->data + lVar7 + 6);
          if ((pMVar14 != pMVar15) &&
             (lVar7 = (long)pMVar15 - (long)((long)&pMVar9->data + 6),
             0xfffffffeffffffff < lVar7 - 0x80000000U)) {
            called_func = (char *)((long)&pMVar9->data + 2);
            iStack_6c = (int)lVar7;
            ctx_00 = prStack_68;
            _MIR_change_code((MIR_context_t)prStack_68,(uint8_t *)called_func,(uint8_t *)&iStack_6c,
                             4);
            pcVar11 = "32";
            addr = pMVar9;
            pMVar15 = pMVar14;
            goto LAB_001545fa;
          }
          if ((*(long *)(lVar4 + 0x18) == 0) || (*(int *)(lVar4 + 0x20) < 2)) goto LAB_0015463f;
          pcVar11 = (char *)*puVar6;
          called_func = 
          "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
          ;
LAB_00154668:
          ctx_00 = _stderr;
          fprintf((FILE *)_stderr,called_func,pcVar11,pMVar9,pMVar14,pMVar15);
        }
        else {
          if (*(uint8_t *)&pMVar9->data != 0xff) {
            __assert_fail("call_addr[0] == 0x40",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
          }
          pMVar14 = *(MIR_item_t_conflict *)((long)&pMVar9->data + lVar7 + 6);
          if (pMVar15 != pMVar14) {
            addr = (MIR_item_t_conflict)((long)&pMVar9->data + lVar7 + 6);
            called_func = (char *)addr;
            ctx_00 = prStack_68;
            _MIR_change_code((MIR_context_t)prStack_68,(uint8_t *)addr,(uint8_t *)&pMStack_60,8);
            pcVar11 = "64";
            pMVar15 = pMVar14;
LAB_001545fa:
            if ((*(long *)(lVar4 + 0x18) != 0) && (1 < *(int *)(lVar4 + 0x20))) {
              pMVar9 = (MIR_item_t_conflict)*puVar6;
              called_func = 
              "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
              ;
              pMVar14 = addr;
              goto LAB_00154668;
            }
          }
        }
LAB_0015463f:
        puVar16 = puVar16 + 2;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
      puVar16 = *(undefined8 **)(*(long *)(lVar4 + 0x138) + 0x60);
      if ((puVar16 == (undefined8 *)0x0) || (puVar16[2] == 0)) {
        MIR_set_gen_interface_cold_1();
        goto LAB_001546c3;
      }
      *puVar16 = 0;
    }
    return;
  }
LAB_001546c3:
  MIR_set_gen_interface_cold_2();
  if ((MIR_item_t_conflict)called_func != (MIR_item_t_conflict)0x0) {
    to = _MIR_get_wrapper((MIR_context_t)ctx_00,(MIR_item_t_conflict)called_func,
                          generate_func_and_redirect_to_func_code);
    _MIR_redirect_thunk((MIR_context_t)ctx_00,((MIR_item_t_conflict)called_func)->addr,to);
    return;
  }
  return;
}

Assistant:

void MIR_gen_finish (MIR_context_t ctx) {
  gen_ctx_t *gen_ctx_ptr = gen_ctx_loc (ctx), gen_ctx = *gen_ctx_ptr;

  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_finish before MIR_gen_init -- good bye\n");
    exit (1);
  }
  finish_data_flow (gen_ctx);
  finish_ssa (gen_ctx);
  finish_gvn (gen_ctx);
  finish_live_ranges (gen_ctx);
  finish_coalesce (gen_ctx);
  finish_ra (gen_ctx);
  finish_combine (gen_ctx);
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++)
    bitmap_destroy (call_used_hard_regs[type]);
  bitmap_destroy (tied_regs);
  bitmap_destroy (addr_regs);
  bitmap_destroy (insn_to_consider);
  bitmap_destroy (func_used_hard_regs);
  target_finish (gen_ctx);
  finish_dead_vars (gen_ctx);
  free (gen_ctx->data_flow_ctx);
  bitmap_destroy (temp_bitmap);
  bitmap_destroy (temp_bitmap2);
  bitmap_destroy (temp_bitmap3);
  VARR_DESTROY (MIR_op_t, temp_ops);
  VARR_DESTROY (MIR_insn_t, temp_insns);
  VARR_DESTROY (MIR_insn_t, temp_insns2);
  VARR_DESTROY (bb_insn_t, temp_bb_insns);
  VARR_DESTROY (bb_insn_t, temp_bb_insns2);
  VARR_DESTROY (loop_node_t, loop_nodes);
  VARR_DESTROY (loop_node_t, queue_nodes);
  VARR_DESTROY (loop_node_t, loop_entries);
  VARR_DESTROY (mem_attr_t, mem_attrs);
  VARR_DESTROY (target_bb_version_t, target_succ_bb_versions);
  VARR_DESTROY (void_ptr_t, succ_bb_addrs);
  VARR_DESTROY (spot_attr_t, spot_attrs);
  VARR_DESTROY (spot_attr_t, spot2attr);
  while (VARR_LENGTH (void_ptr_t, to_free) != 0) free (VARR_POP (void_ptr_t, to_free));
  VARR_DESTROY (void_ptr_t, to_free);
  if (collect_bb_stat_p)
    fprintf (stderr, "Overall bbs num = %llu, generated bbs num = %llu\n", overall_bbs_num,
             overall_gen_bbs_num);
  free (gen_ctx);
  *gen_ctx_ptr = NULL;
}